

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

void __thiscall SNMPPacket::~SNMPPacket(SNMPPacket *this)

{
  SNMPPacket *this_local;
  
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_0028f7f0;
  if (this->packet != (ComplexType *)0x0) {
    (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  std::deque<VarBind,_std::allocator<VarBind>_>::~deque(&this->varbindList);
  std::__cxx11::string::~string((string *)&this->communityString);
  Catch::clara::std::shared_ptr<OctetType>::~shared_ptr
            ((shared_ptr<OctetType> *)&this->communityStringPtr);
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
            ((shared_ptr<IntegerType> *)&this->snmpVersionPtr);
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
            ((shared_ptr<IntegerType> *)&this->requestIDPtr);
  return;
}

Assistant:

SNMPPacket::~SNMPPacket(){
    delete this->packet;
}